

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5MultiIterFree(Fts5Iter *pIter)

{
  Fts5Buffer *pFVar1;
  int iVar2;
  Fts5TombstoneArray *p;
  long lVar3;
  long lVar4;
  Fts5SegIter *pFVar5;
  
  if (pIter != (Fts5Iter *)0x0) {
    if (0 < pIter->nSeg) {
      lVar4 = 0;
      do {
        sqlite3_free(pIter->aSeg[lVar4].term.p);
        pFVar1 = &pIter->aSeg[lVar4].term;
        pFVar1->p = (u8 *)0x0;
        pFVar1->n = 0;
        pFVar1->nSpace = 0;
        sqlite3_free(pIter->aSeg[lVar4].pLeaf);
        sqlite3_free(pIter->aSeg[lVar4].pNextLeaf);
        p = pIter->aSeg[lVar4].pTombArray;
        if ((p != (Fts5TombstoneArray *)0x0) && (iVar2 = p->nRef, p->nRef = iVar2 + -1, iVar2 < 2))
        {
          if (0 < p->nTombstone) {
            lVar3 = 0;
            do {
              sqlite3_free(p->apTombstone[lVar3]);
              lVar3 = lVar3 + 1;
            } while (lVar3 < p->nTombstone);
          }
          sqlite3_free(p);
        }
        pFVar5 = pIter->aSeg + lVar4;
        fts5DlidxIterFree(pFVar5->pDlidx);
        sqlite3_free(pFVar5->aRowidOffset);
        pFVar5->iRowid = 0;
        pFVar5->nPos = 0;
        pFVar5->bDel = '\0';
        *(undefined3 *)&pFVar5->field_0x7d = 0;
        (pFVar5->term).p = (u8 *)0x0;
        (pFVar5->term).n = 0;
        (pFVar5->term).nSpace = 0;
        pFVar5->aRowidOffset = (int *)0x0;
        pFVar5->pDlidx = (Fts5DlidxIter *)0x0;
        pFVar5->iPgidxOff = 0;
        pFVar5->iEndofDoclist = 0;
        pFVar5->iRowidOffset = 0;
        pFVar5->nRowidOffset = 0;
        pFVar5->xNext = (_func_void_Fts5Index_ptr_Fts5SegIter_ptr_int_ptr *)0x0;
        pFVar5->iTermLeafPgno = 0;
        pFVar5->iTermLeafOffset = 0;
        pFVar5->iLeafOffset = 0;
        pFVar5->pTombArray = (Fts5TombstoneArray *)0x0;
        pFVar5->pLeaf = (Fts5Data *)0x0;
        pFVar5->pNextLeaf = (Fts5Data *)0x0;
        pFVar5->pSeg = (Fts5StructureSegment *)0x0;
        pFVar5->flags = 0;
        pFVar5->iLeafPgno = 0;
        lVar4 = lVar4 + 1;
      } while (lVar4 < pIter->nSeg);
    }
    sqlite3_free((pIter->poslist).p);
    (pIter->poslist).p = (u8 *)0x0;
    (pIter->poslist).n = 0;
    (pIter->poslist).nSpace = 0;
    sqlite3_free(pIter);
    return;
  }
  return;
}

Assistant:

static void fts5MultiIterFree(Fts5Iter *pIter){
  if( pIter ){
    int i;
    for(i=0; i<pIter->nSeg; i++){
      fts5SegIterClear(&pIter->aSeg[i]);
    }
    fts5BufferFree(&pIter->poslist);
    sqlite3_free(pIter);
  }
}